

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::RegExpGroupInstr::RegExpGroupInstr(RegExpGroupInstr *this,ConstantInt *groupId,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_51;
  ConstantInt *local_50;
  ConstantInt **local_48;
  size_type local_40;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  string *local_20;
  string *name_local;
  ConstantInt *groupId_local;
  RegExpGroupInstr *this_local;
  
  local_48 = &local_50;
  local_40 = 1;
  local_50 = groupId;
  local_20 = name;
  name_local = (string *)groupId;
  groupId_local = (ConstantInt *)this;
  std::allocator<flow::Value_*>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = (iterator)local_48;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_38,__l,&local_51);
  Instr::Instr(&this->super_Instr,String,&local_38,local_20);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_38);
  std::allocator<flow::Value_*>::~allocator(&local_51);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__RegExpGroupInstr_002ba450;
  return;
}

Assistant:

RegExpGroupInstr(ConstantInt* groupId, const std::string& name)
      : Instr{LiteralType::String, {groupId}, name} {}